

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O2

void __thiscall
IsorecursiveTest_TestSubtypeErrors_Test::TestBody(IsorecursiveTest_TestSubtypeErrors_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 uVar4;
  HeapType HVar5;
  char *in_R9;
  Signature signature;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  Array local_d8;
  Array local_c8;
  Type local_b8;
  Type eqref;
  Type funcref;
  Type local_a0;
  undefined1 auStack_98 [8];
  AssertionResult gtest_ar_;
  Type local_80;
  Type anyref;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Stack_68;
  TypeBuilder builder;
  undefined1 local_50 [39];
  allocator_type local_29;
  undefined1 local_28 [8];
  TypeBuilder builder_3;
  
  wasm::Type::Type(&local_80,(HeapType)0x2,Nullable);
  wasm::Type::Type(&local_b8,(HeapType)0x3,Nullable);
  wasm::Type::Type(&eqref,(HeapType)0x1,Nullable);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffff98,2);
  local_50._8_8_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_80.id;
  local_50._0_8_ = (pointer)&stack0xffffffffffffff98;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_50,(Signature)(auVar1 << 0x40));
  local_50._8_8_ = 1;
  signature.results.id = 0;
  signature.params.id = local_80.id;
  local_50._0_8_ = (pointer)&stack0xffffffffffffff98;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_50,signature);
  local_50._8_8_ = 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  auStack_98 = (undefined1  [8])&stack0xffffffffffffff98;
  local_50._0_8_ = (pointer)&stack0xffffffffffffff98;
  HVar5 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_98);
  wasm::TypeBuilder::Entry::subTypeOf((Entry *)local_50,HVar5);
  wasm::TypeBuilder::build();
  auStack_98[0] = (internal)(local_50[0x18] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)local_50);
  if (auStack_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&anyref);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)auStack_98,(AssertionResult *)"builder.build()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x34b,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&anyref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    std::__cxx11::string::~string((string *)local_50);
    if (anyref.id != 0) {
      (**(code **)(*(long *)anyref.id + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffff98);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffff98,2);
  local_50._0_8_ = local_80.id;
  local_50._8_8_ = local_80.id;
  wasm::Type::Type(&funcref,local_50,2);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = funcref.id;
  auStack_98 = (undefined1  [8])&stack0xffffffffffffff98;
  wasm::TypeBuilder::Entry::operator=((Entry *)auStack_98,(Signature)(auVar2 << 0x40));
  local_50._0_8_ = local_80.id;
  local_50._8_8_ = local_80.id;
  local_50._16_8_ = local_80.id;
  wasm::Type::Type(&local_a0,local_50,3);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_a0.id;
  auStack_98 = (undefined1  [8])&stack0xffffffffffffff98;
  wasm::TypeBuilder::Entry::operator=((Entry *)auStack_98,(Signature)(auVar3 << 0x40));
  local_50._8_8_ = 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  auStack_98 = (undefined1  [8])&stack0xffffffffffffff98;
  local_50._0_8_ = (pointer)&stack0xffffffffffffff98;
  HVar5 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_98);
  wasm::TypeBuilder::Entry::subTypeOf((Entry *)local_50,HVar5);
  wasm::TypeBuilder::build();
  auStack_98[0] = (internal)(local_50[0x18] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)local_50);
  if (auStack_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&anyref);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)auStack_98,(AssertionResult *)"builder.build()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x354,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&anyref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    std::__cxx11::string::~string((string *)local_50);
    if (anyref.id != 0) {
      (**(code **)(*(long *)anyref.id + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffff98);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffff98,2);
  local_d8.element.type.id = local_80.id;
  local_d8.element.packedType = not_packed;
  local_d8.element.mutable_ = Mutable;
  local_50._8_8_ = 0;
  local_50._0_8_ = (pointer)&stack0xffffffffffffff98;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_50,&local_d8);
  local_c8.element.type.id = local_b8.id;
  local_c8.element.packedType = not_packed;
  local_c8.element.mutable_ = Mutable;
  local_50._8_8_ = 1;
  local_50._0_8_ = (pointer)&stack0xffffffffffffff98;
  wasm::TypeBuilder::Entry::operator=((Entry *)local_50,&local_c8);
  local_50._8_8_ = 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  auStack_98 = (undefined1  [8])&stack0xffffffffffffff98;
  local_50._0_8_ = (pointer)&stack0xffffffffffffff98;
  HVar5 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_98);
  wasm::TypeBuilder::Entry::subTypeOf((Entry *)local_50,HVar5);
  wasm::TypeBuilder::build();
  auStack_98[0] = (internal)(local_50[0x18] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)local_50);
  if (auStack_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&anyref);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)auStack_98,(AssertionResult *)"builder.build()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x35d,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&anyref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    std::__cxx11::string::~string((string *)local_50);
    if (anyref.id != 0) {
      (**(code **)(*(long *)anyref.id + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffff98);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)local_28,2);
  local_50._0_8_ = local_80.id;
  local_50._8_8_ = 0;
  local_50._16_8_ = local_80.id;
  local_50._24_8_ = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_50;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffff98,__l,
             &local_29);
  auStack_98 = (undefined1  [8])_Stack_68._M_head_impl;
  gtest_ar_._0_8_ =
       builder.impl._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  _Stack_68._M_head_impl = (Impl *)0x0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  anyref.id = (uintptr_t)local_28;
  wasm::TypeBuilder::Entry::operator=((Entry *)&anyref,(Struct *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffff98);
  local_50._0_8_ = eqref.id;
  local_50._8_8_ = 0;
  local_50._16_8_ = local_80.id;
  local_50._24_8_ = 0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_50;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffff98,__l_00,
             &local_29);
  auStack_98 = (undefined1  [8])_Stack_68._M_head_impl;
  gtest_ar_._0_8_ =
       builder.impl._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  _Stack_68._M_head_impl = (Impl *)0x0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  anyref.id = (uintptr_t)local_28;
  wasm::TypeBuilder::Entry::operator=((Entry *)&anyref,(Struct *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_98);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffff98);
  local_50._8_8_ = 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  auStack_98 = (undefined1  [8])local_28;
  local_50._0_8_ = (pointer)local_28;
  HVar5 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)auStack_98);
  wasm::TypeBuilder::Entry::subTypeOf((Entry *)local_50,HVar5);
  wasm::TypeBuilder::build();
  uVar4 = local_50[0x18];
  auStack_98[0] = (internal)(local_50[0x18] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)local_50);
  if (uVar4 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)auStack_98,(AssertionResult *)"builder.build()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&anyref,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x366,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&anyref,(Message *)&stack0xffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&anyref);
    std::__cxx11::string::~string((string *)local_50);
    if ((_Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>)_Stack_68._M_head_impl !=
        (_Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>)0x0) {
      (**(code **)(*(long *)_Stack_68._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)local_28);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, TestSubtypeErrors) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);
  Type funcref = Type(HeapType::func, Nullable);

  {
    // Incompatible signatures.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, anyref);
    builder[1] = Signature(anyref, Type::none);
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Signatures incompatible in tuple size.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, {anyref, anyref});
    builder[1] = Signature(Type::none, {anyref, anyref, anyref});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Mutable array fields are invariant.
    TypeBuilder builder(2);
    builder[0] = Array(Field(anyref, Mutable));
    builder[1] = Array(Field(eqref, Mutable));
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Incompatible struct prefixes
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable), Field(anyref, Immutable)});
    builder[1] = Struct({Field(funcref, Immutable), Field(anyref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }
}